

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_WriteSharedArrayBuffer(BCWriterState *s,JSValue obj)

{
  DynBuf *s_00;
  uint32_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong local_20;
  
  puVar1 = *(uint32_t **)((long)obj.u.ptr + 0x30);
  s_00 = &s->dbuf;
  dbuf_putc(s_00,'\x12');
  dbuf_put_leb128(s_00,*puVar1);
  local_20 = *(ulong *)(puVar1 + 2);
  if (s->field_0x38 != '\0') {
    local_20 = local_20 >> 0x38 | (local_20 & 0xff000000000000) >> 0x28 |
               (local_20 & 0xff0000000000) >> 0x18 | (local_20 & 0xff00000000) >> 8 |
               (local_20 & 0xff000000) << 8 | (local_20 & 0xff0000) << 0x18 |
               (local_20 & 0xff00) << 0x28 | local_20 << 0x38;
  }
  dbuf_put(s_00,(uint8_t *)&local_20,8);
  if ((s->sab_tab_size <= s->sab_tab_len) &&
     (iVar3 = js_realloc_array(s->ctx,&s->sab_tab,8,&s->sab_tab_size,s->sab_tab_len + 1), iVar3 != 0
     )) {
    return -1;
  }
  puVar2 = *(uint8_t **)(puVar1 + 2);
  iVar3 = s->sab_tab_len;
  s->sab_tab_len = iVar3 + 1;
  s->sab_tab[iVar3] = puVar2;
  return 0;
}

Assistant:

static int JS_WriteSharedArrayBuffer(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    JSArrayBuffer *abuf = p->u.array_buffer;
    assert(!abuf->detached); /* SharedArrayBuffer are never detached */
    bc_put_u8(s, BC_TAG_SHARED_ARRAY_BUFFER);
    bc_put_leb128(s, abuf->byte_length);
    bc_put_u64(s, (uintptr_t)abuf->data);
    if (js_resize_array(s->ctx, (void **)&s->sab_tab, sizeof(s->sab_tab[0]),
                        &s->sab_tab_size, s->sab_tab_len + 1))
        return -1;
    /* keep the SAB pointer so that the user can clone it or free it */
    s->sab_tab[s->sab_tab_len++] = abuf->data;
    return 0;
}